

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O1

void __thiscall irr::gui::CGUITabControl::~CGUITabControl(CGUITabControl *this)

{
  ~CGUITabControl(this,&VTT);
  operator_delete(this,0x1a0);
  return;
}

Assistant:

CGUITabControl::~CGUITabControl()
{
	for (u32 i = 0; i < Tabs.size(); ++i) {
		if (Tabs[i])
			Tabs[i]->drop();
	}

	if (UpButton)
		UpButton->drop();

	if (DownButton)
		DownButton->drop();
}